

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillLeftConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pb;
  Orientation OVar1;
  Node *node_00;
  
  node_00 = node->prev;
  while( true ) {
    Fill(this,tcx,node_00);
    node_00 = node->prev;
    pb = node_00->point;
    if (pb == edge->p) {
      return;
    }
    OVar1 = Orient2d(edge->q,pb,edge->p);
    if (OVar1 != CW) break;
    OVar1 = Orient2d(node->point,pb,node_00->prev->point);
    if (OVar1 != CW) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.prev);
  if (node.prev->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->point, *edge->p) == CW) {
      // Below
      if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
        // Next is concave
        FillLeftConcaveEdgeEvent(tcx, edge, node);
      } else{
        // Next is convex
      }
    }
  }

}